

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Elf32.cpp
# Opt level: O3

Elf32_Ehdr * elf::arch32::GetHeader(void *data)

{
  uint8_t uVar1;
  Elf32_Ehdr *pEVar2;
  Elf32_Ehdr *ret;
  
  if (*data != 0x464c457f) {
    return (Elf32_Ehdr *)0x0;
  }
  uVar1 = GetClass(data);
  pEVar2 = (Elf32_Ehdr *)0x0;
  if (uVar1 == '\x01') {
    pEVar2 = (Elf32_Ehdr *)data;
  }
  return pEVar2;
}

Assistant:

Elf32_Ehdr* elf::arch32::GetHeader(void* data) {
    Elf32_Ehdr* ret = (Elf32_Ehdr*) data;

    if(memcmp(ret->e_ident, ELFMAG, SELFMAG) != 0)
        return NULL; // Invalid ELF

    if(GetClass(data) != ELFCLASS32)
        return NULL; // x64 only

    return ret;
}